

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::SetDomain(ON_PolylineCurve *this,double t0,double t1)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  double dVar6;
  ON_Interval new_domain;
  ON_Interval old_domain;
  
  iVar1 = (this->m_t).m_count;
  if (1 < iVar1) {
    pdVar2 = (this->m_t).m_a;
    dVar6 = *pdVar2;
    uVar4 = (ulong)(iVar1 - 1);
    if ((dVar6 == t0) && (!NAN(dVar6) && !NAN(t0))) {
      dVar6 = pdVar2[uVar4];
      bVar3 = true;
      if ((dVar6 == t1) && (!NAN(dVar6) && !NAN(t1))) goto LAB_0059c274;
    }
    if (t0 < t1) {
      dVar6 = t1;
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      old_domain.m_t[1] = dVar6;
      ON_Interval::ON_Interval(&new_domain,t0,t1);
      pdVar2 = (this->m_t).m_a;
      *pdVar2 = t0;
      pdVar2[uVar4] = t1;
      for (uVar5 = 1; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        dVar6 = ON_Interval::NormalizedParameterAt(&old_domain,pdVar2[uVar5]);
        dVar6 = ON_Interval::ParameterAt(&new_domain,dVar6);
        pdVar2 = (this->m_t).m_a;
        pdVar2[uVar5] = dVar6;
      }
      bVar3 = true;
      goto LAB_0059c274;
    }
  }
  bVar3 = false;
LAB_0059c274:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar3;
}

Assistant:

bool ON_PolylineCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  const int count = m_t.Count()-1;
  if ( count >= 1 )
  {
    if ( t0 == m_t[0] && t1 == m_t[count] )
      rc = true;
    else if ( t0 < t1 ) 
    {
      const ON_Interval old_domain = Domain();
      const ON_Interval new_domain(t0,t1);
      m_t[0] = t0;
      m_t[count] = t1;
      for ( int i = 1; i < count; i++ )
      {
        m_t[i] = new_domain.ParameterAt( old_domain.NormalizedParameterAt(m_t[i]) );
      }      
			rc=true;
    }
  }
	DestroyCurveTree();
  return rc;  
}